

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tattoo.c
# Opt level: O1

void do_invoke_gabe(CHAR_DATA *ch)

{
  OBJ_DATA *arg1;
  char *format;
  
  if (ch->position == 7) {
    format = "You can not invoke your lords power during a fight!";
    arg1 = (OBJ_DATA *)0x0;
  }
  else {
    arg1 = get_eq_char(ch,0x13);
    act("$n\'s $p glows a bright gold.",ch,arg1,(void *)0x0,0);
    format = "Your $p glows a bright gold.";
  }
  act(format,ch,arg1,(void *)0x0,3);
  return;
}

Assistant:

void do_invoke_gabe(CHAR_DATA *ch)
{
	OBJ_DATA *obj;

	if (ch->position == POS_FIGHTING)
	{
		act("You can not invoke your lords power during a fight!", ch, 0, 0, TO_CHAR);
		return;
	}

	obj = get_eq_char(ch, WEAR_BRAND);

	act("$n's $p glows a bright gold.", ch, obj, 0, TO_ROOM);
	act("Your $p glows a bright gold.", ch, obj, 0, TO_CHAR);
}